

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall TPZMatrix<Fad<double>_>::Simetrize(TPZMatrix<Fad<double>_> *this)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  undefined4 extraout_var;
  TPZBaseMatrix *in_RDI;
  int64_t fDim1;
  int64_t col;
  int64_t row;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  long local_18;
  long local_10;
  Fad<double> *pFVar4;
  
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  iVar3 = TPZBaseMatrix::Cols(in_RDI);
  if (iVar2 != iVar3) {
    Error(in_stack_000001d0,in_stack_000001c8);
  }
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  for (local_10 = 0; local_18 = local_10, local_10 < iVar2; local_10 = local_10 + 1) {
    while (local_18 = local_18 + 1, local_18 < iVar2) {
      iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x22])(in_RDI,local_10,local_18);
      pFVar4 = (Fad<double> *)CONCAT44(extraout_var,iVar1);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x22])(in_RDI,local_18,local_10);
      Fad<double>::operator=((Fad<double> *)in_RDI,pFVar4);
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Simetrize() {
  
  if ( Rows() != Cols() ) {
    Error( "Simetrize only work for square matrices" );
  }
  
  int64_t row,col;
  int64_t fDim1 = Rows();
  for(row=0; row<fDim1; row++) {
    for(col=row+1; col<fDim1; col++) {
      this->s(col,row) = this->s(row,col);
    }
  }
  
}